

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CPU.cpp
# Opt level: O0

void __thiscall CPU::BIT_AB(CPU *this)

{
  byte bVar1;
  uint16_t address;
  uint8_t data;
  CPU *this_local;
  
  this->cycles = 4;
  address = GetWord(this);
  bVar1 = ReadByte(this,address);
  (this->field_6).ps = (this->field_6).ps & 0xfd | ((this->A & bVar1) == 0) << 1;
  (this->field_6).ps =
       (this->field_6).ps & 0xbf | ((bVar1 & 0x40) != 0 && -1 < (int)(bVar1 & 0x40)) << 6;
  (this->field_6).ps =
       (this->field_6).ps & 0x7f | ((bVar1 & 0x80) != 0 && -1 < (int)(bVar1 & 0x80)) << 7;
  return;
}

Assistant:

void CPU::BIT_AB()
{
    cycles = 4;
    uint8_t data = ReadByte(GetWord());
    Z = !(A & data);
    V = (data & 0b01000000) > 0;
    N = (data & 0b10000000) > 0;
}